

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Vec_Int_t * Gia_ManFindMapping(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vMap2Chain;
  int local_38;
  int iFadd;
  int k;
  int i;
  Vec_Int_t *vChain;
  Vec_Wec_t *vChains_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *p_local;
  
  vMap2Chain._4_4_ = -1;
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  iFadd = 0;
  while( true ) {
    iVar1 = Vec_WecSize(vChains);
    if (iVar1 <= iFadd) {
      return p_00;
    }
    p_01 = Vec_WecEntry(vChains,iFadd);
    iVar1 = Vec_IntSize(p_01);
    if (iVar1 < 1) {
      __assert_fail("Vec_IntSize(vChain) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x23c,
                    "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    for (local_38 = 0; iVar1 = Vec_IntSize(p_01), local_38 < iVar1; local_38 = local_38 + 1) {
      vMap2Chain._4_4_ = Vec_IntEntry(p_01,local_38);
      iVar1 = Vec_IntEntry(vFadds,vMap2Chain._4_4_ * 5 + 3);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 != -1) {
        __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x240,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar1 = Vec_IntEntry(vFadds,vMap2Chain._4_4_ * 5 + 3);
      Vec_IntWriteEntry(p_00,iVar1,iFadd);
    }
    iVar1 = Vec_IntEntry(vFadds,vMap2Chain._4_4_ * 5 + 4);
    iVar1 = Vec_IntEntry(p_00,iVar1);
    if (iVar1 != -1) break;
    iVar1 = Vec_IntEntry(vFadds,vMap2Chain._4_4_ * 5 + 4);
    Vec_IntWriteEntry(p_00,iVar1,iFadd);
    iFadd = iFadd + 1;
  }
  __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                ,0x244,
                "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)")
  ;
}

Assistant:

Vec_Int_t * Gia_ManFindMapping( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd = -1;
    Vec_Int_t * vMap2Chain = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        assert( Vec_IntSize(vChain) > 0 );
        Vec_IntForEachEntry( vChain, iFadd, k )
        {
            //printf( "Chain %d: setting SUM %d (obj %d)\n", i, k, Vec_IntEntry(vFadds, 5*iFadd+3) );
            assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1 );
            Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3), i );
        }
        //printf( "Chain %d: setting CARRY (obj %d)\n", i, Vec_IntEntry(vFadds, 5*iFadd+4) );
        assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1 );
        Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4), i );
    }
    return vMap2Chain;
}